

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scorer.cc
# Opt level: O2

void predict_or_learn<true,&expf>(scorer *s,single_learner *base,example *ec)

{
  loss_function *plVar1;
  float extraout_XMM0_Da;
  float fVar2;
  
  (*s->all->set_minmax)(s->all->sd,(ec->l).simple.label);
  fVar2 = (ec->l).simple.label;
  if (((fVar2 == 3.4028235e+38) && (!NAN(fVar2))) || (ec->weight <= 0.0)) {
    LEARNER::learner<char,_example>::predict(base,ec,0);
  }
  else {
    LEARNER::learner<char,_example>::learn(base,ec,0);
  }
  if (0.0 < ec->weight) {
    fVar2 = (ec->l).simple.label;
    if ((fVar2 != 3.4028235e+38) || (NAN(fVar2))) {
      plVar1 = s->all->loss;
      (*plVar1->_vptr_loss_function[1])((ec->pred).scalar,plVar1,s->all->sd);
      ec->loss = extraout_XMM0_Da * ec->weight;
    }
  }
  fVar2 = expf((ec->pred).scalar);
  (ec->pred).scalar = fVar2;
  return;
}

Assistant:

void predict_or_learn(scorer& s, LEARNER::single_learner& base, example& ec)
{
  s.all->set_minmax(s.all->sd, ec.l.simple.label);
  if (is_learn && ec.l.simple.label != FLT_MAX && ec.weight > 0)
    base.learn(ec);
  else
    base.predict(ec);

  if (ec.weight > 0 && ec.l.simple.label != FLT_MAX)
    ec.loss = s.all->loss->getLoss(s.all->sd, ec.pred.scalar, ec.l.simple.label) * ec.weight;

  ec.pred.scalar = link(ec.pred.scalar);
}